

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O2

void __thiscall
google::protobuf::json_internal::ParseProto3Type::SetString
          (ParseProto3Type *this,Field f,Msg *msg,string_view x)

{
  RecordAsSeen((Field)this,(Msg *)f);
  io::CodedOutputStream::WriteVarint32
            ((CodedOutputStream *)f,*(int *)(*(long *)(this + 8) + 0x50) * 8 + 2);
  io::CodedOutputStream::WriteVarint64((CodedOutputStream *)f,(uint64_t)msg);
  io::CodedOutputStream::WriteRaw((CodedOutputStream *)f,(void *)x._M_len,(int)msg);
  return;
}

Assistant:

static void SetString(Field f, Msg& msg, absl::string_view x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3 |
                         WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    msg.stream_.WriteVarint64(static_cast<uint64_t>(x.size()));
    msg.stream_.WriteRaw(x.data(), x.size());
  }